

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O0

int nn_timerset_timeout(nn_timerset *self)

{
  int iVar1;
  nn_list_item *pnVar2;
  uint64_t uVar3;
  nn_list *in_RDI;
  int timeout;
  int local_2c;
  nn_list_item *local_20;
  int local_4;
  
  iVar1 = nn_list_empty(in_RDI);
  if (iVar1 == 0) {
    pnVar2 = nn_list_begin(in_RDI);
    if (pnVar2 == (nn_list_item *)0x0) {
      local_20 = (nn_list_item *)0x0;
    }
    else {
      local_20 = nn_list_begin(in_RDI);
    }
    pnVar2 = local_20[1].next;
    uVar3 = nn_clock_ms();
    local_2c = (int)pnVar2 - (int)uVar3;
    if (local_2c < 0) {
      local_2c = 0;
    }
    local_4 = local_2c;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int nn_timerset_timeout (struct nn_timerset *self)
{
    int timeout;

    if (nn_fast (nn_list_empty (&self->timeouts)))
        return -1;

    timeout = (int) (nn_cont (nn_list_begin (&self->timeouts),
        struct nn_timerset_hndl, list)->timeout - nn_clock_ms());
    return timeout < 0 ? 0 : timeout;
}